

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::MessageBuilder::~MessageBuilder(MessageBuilder *this)

{
  MessageInfo *in_RDI;
  
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(in_RDI + 1));
  MessageInfo::~MessageInfo(in_RDI);
  return;
}

Assistant:

MessageBuilder( std::string const& macroName,
                        SourceLineInfo const& lineInfo,
                        ResultWas::OfType type )
        : m_info( macroName, lineInfo, type )
        {}